

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke.c
# Opt level: O2

int build_suite_id(ptls_buffer_t *buf,ptls_hpke_kem_t *kem,ptls_hpke_cipher_suite_t *cipher)

{
  ushort uVar1;
  int iVar2;
  ushort *src;
  ushort local_20;
  ushort local_1e;
  ushort local_1c;
  ushort local_1a;
  
  if (cipher == (ptls_hpke_cipher_suite_t *)0x0) {
    iVar2 = ptls_buffer__do_pushv(buf,"KEM",3);
    if (iVar2 != 0) {
      return iVar2;
    }
    uVar1 = kem->id << 8 | kem->id >> 8;
    src = &local_1a;
  }
  else {
    iVar2 = ptls_buffer__do_pushv(buf,"HPKE",4);
    if (iVar2 != 0) {
      return iVar2;
    }
    local_1c = kem->id << 8 | kem->id >> 8;
    iVar2 = ptls_buffer__do_pushv(buf,&local_1c,2);
    if (iVar2 != 0) {
      return iVar2;
    }
    uVar1 = (cipher->id).kdf;
    local_1e = uVar1 << 8 | uVar1 >> 8;
    iVar2 = ptls_buffer__do_pushv(buf,&local_1e,2);
    if (iVar2 != 0) {
      return iVar2;
    }
    uVar1 = (cipher->id).aead;
    uVar1 = uVar1 << 8 | uVar1 >> 8;
    src = &local_20;
  }
  *src = uVar1;
  iVar2 = ptls_buffer__do_pushv(buf,src,2);
  if (iVar2 == 0) {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int build_suite_id(ptls_buffer_t *buf, ptls_hpke_kem_t *kem, ptls_hpke_cipher_suite_t *cipher)
{
    int ret;

    if (cipher == NULL) {
        ptls_buffer_pushv(buf, "KEM", 3);
        ptls_buffer_push16(buf, kem->id);
    } else {
        ptls_buffer_pushv(buf, "HPKE", 4);
        ptls_buffer_push16(buf, kem->id);
        ptls_buffer_push16(buf, cipher->id.kdf);
        ptls_buffer_push16(buf, cipher->id.aead);
    }

    ret = 0;

Exit:
    return ret;
}